

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O3

void __thiscall WSNTopologyBasedEnergy::SelectLeaderID(WSNTopologyBasedEnergy *this)

{
  vector<WSNNode,_std::allocator<WSNNode>_> *pvVar1;
  WSNNode *this_00;
  WSNNode *pWVar2;
  Scalar *pSVar3;
  double *pdVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  WSNTopologyBasedEnergy *this_01;
  pointer this_02;
  long lVar8;
  long *local_d0 [2];
  long local_c0 [2];
  WSNNode *local_b0;
  vector<WSNNode,_std::allocator<WSNNode>_> *local_a8;
  _InputArray local_a0;
  WSNNode local_88;
  
  local_a8 = this->LayerLeaderSeq;
  local_b0 = this->LayerLeaderNode;
  iVar7 = 0;
  do {
    pvVar1 = local_a8 + iVar7;
    this_02 = (pvVar1->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (this_02 ==
        (pvVar1->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar8 = 0;
    }
    else {
      lVar8 = 0;
      do {
        iVar6 = WSNNode::GetNodeID(this_02);
        if (this->ThresEnergy[iVar7] <= this->node[iVar6].energy) {
          this_00 = local_b0 + iVar7;
          iVar6 = this_02->id;
          local_b0[iVar7].leaderID = this_02->leaderID;
          local_b0[iVar7].id = iVar6;
          iVar6 = this_02->y;
          dVar5 = this_02->energy;
          pWVar2 = local_b0 + iVar7;
          pWVar2->x = this_02->x;
          pWVar2->y = iVar6;
          pWVar2->energy = dVar5;
          local_b0[iVar7].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (this_02->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          local_b0[iVar7].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (this_02->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
          local_b0[iVar7].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (this_02->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
          local_b0[iVar7].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (this_02->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
          iVar6 = WSNNode::GetNodeID(this_00);
          local_88.leaderID = this->node[iVar6].leaderID;
          local_88.id = this->node[iVar6].id;
          pWVar2 = this->node + iVar6;
          local_88.x = pWVar2->x;
          local_88.y = pWVar2->y;
          local_88.energy = pWVar2->energy;
          pSVar3 = &this->node[iVar6].color;
          local_88.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_88.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar3->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar4 = this->node[iVar6].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          local_88.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar4;
          local_88.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar4[1];
          iVar6 = WSNNode::GetNodeID(this_00);
          this_01 = (WSNTopologyBasedEnergy *)&stack0xffffffffffffffb0;
          WSNNode::NodeColor((Scalar *)this_01,this->node + iVar6);
          drawCrossNode(this_01,&this->img,&local_88,(Scalar *)&stack0xffffffffffffffb0);
          WSNNode::~WSNNode(&local_88);
          local_d0[0] = local_c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"WSN","");
          local_a0.sz.width = 0;
          local_a0.sz.height = 0;
          local_a0.flags = 0x1010000;
          local_a0.obj = this;
          cv::imshow((string *)local_d0,&local_a0);
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],local_c0[0] + 1);
          }
          iVar7 = iVar7 + 1;
          goto LAB_00105dcd;
        }
        this_02 = this_02 + 1;
        lVar8 = lVar8 + 1;
      } while (this_02 !=
               (pvVar1->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (((long)this_02 -
         (long)(pvVar1->super__Vector_base<WSNNode,_std::allocator<WSNNode>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 - lVar8 == 0) {
      this->ThresEnergy[iVar7] = this->ThresEnergy[iVar7] * 3.0 * 0.25;
      this->Mark[iVar7] = this->Mark[iVar7] + 1;
    }
LAB_00105dcd:
    if (4 < iVar7) {
      return;
    }
  } while( true );
}

Assistant:

void WSNTopologyBasedEnergy::SelectLeaderID()
{
	vector<WSNNode>::iterator it;
	int i=0;
	while(i<LayerNum)
	{
		int j=0;
		bool   BREAK=false;
		for(it=LayerLeaderSeq[i].begin();it!=LayerLeaderSeq[i].end();it++)
		{
			if(node[it->GetNodeID()].energy>=ThresEnergy[i])
			{
				LayerLeaderNode[i]=*it;
				drawCrossNode(img,node[LayerLeaderNode[i].GetNodeID()],node[LayerLeaderNode[i].GetNodeID()].NodeColor());
				imshow("WSN",img);
				i++;
				BREAK=true;
				break;
			}
			j++;
		}
		if(BREAK) continue;
		if(j==LayerLeaderSeq[i].size())
		{
			ThresEnergy[i]=3*ThresEnergy[i]/4;
			Mark[i]++;
		}

	}
}